

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.cc
# Opt level: O0

uint32_t crc32_8(void *data,size_t len,uint32_t prev_value)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uchar *cur_byte;
  uint32_t two;
  uint32_t one;
  uint32_t crc;
  uint32_t *cur;
  uint32_t prev_value_local;
  size_t len_local;
  void *data_local;
  
  crc = prev_value ^ 0xffffffff;
  cur = (uint32_t *)data;
  for (len_local = len; 7 < len_local; len_local = len_local - 8) {
    puVar3 = cur + 1;
    uVar2 = *cur ^ crc;
    cur = cur + 2;
    uVar1 = *puVar3;
    crc = crc_lookup[7][uVar2 & 0xff] ^ crc_lookup[6][uVar2 >> 8 & 0xff] ^
          crc_lookup[5][uVar2 >> 0x10 & 0xff] ^ crc_lookup[4][uVar2 >> 0x18] ^
          crc_lookup[3][uVar1 & 0xff] ^ crc_lookup[2][uVar1 >> 8 & 0xff] ^
          crc_lookup[1][uVar1 >> 0x10 & 0xff] ^ crc_lookup[0][uVar1 >> 0x18];
  }
  cur_byte = (uchar *)cur;
  while (len_local != 0) {
    crc = crc >> 8 ^ crc_lookup[0][crc & 0xff ^ (uint)*cur_byte];
    cur_byte = cur_byte + 1;
    len_local = len_local - 1;
  }
  return crc ^ 0xffffffff;
}

Assistant:

uint32_t crc32_8(const void* data, size_t len, uint32_t prev_value)
{
    uint32_t *cur = (uint32_t*) data;
    uint32_t crc = ~prev_value;

    while (len >= 8) {
#ifdef _BIG_ENDIAN
        uint32_t one = *cur++ ^ bitswap32(crc);
        uint32_t two = *cur++;
        crc =
            crc_lookup[7][(one>>24) & 0xFF] ^
            crc_lookup[6][(one>>16) & 0xFF] ^
            crc_lookup[5][(one>> 8) & 0xFF] ^
            crc_lookup[4][(one    ) & 0xFF] ^
            crc_lookup[3][(two>>24) & 0xFF] ^
            crc_lookup[2][(two>>16) & 0xFF] ^
            crc_lookup[1][(two>> 8) & 0xFF] ^
            crc_lookup[0][(two    ) & 0xFF];
#else
        uint32_t one = *cur++ ^ crc;
        uint32_t two = *cur++;
        crc =
            crc_lookup[7][(one    ) & 0xFF] ^
            crc_lookup[6][(one>> 8) & 0xFF] ^
            crc_lookup[5][(one>>16) & 0xFF] ^
            crc_lookup[4][(one>>24) & 0xFF] ^
            crc_lookup[3][(two    ) & 0xFF] ^
            crc_lookup[2][(two>> 8) & 0xFF] ^
            crc_lookup[1][(two>>16) & 0xFF] ^
            crc_lookup[0][(two>>24) & 0xFF];
#endif
        len -= 8;
    }

    unsigned char *cur_byte = (unsigned char*) cur;
    while (len--)
        crc = (crc >> 8) ^ crc_lookup[0][(crc & 0xFF) ^ *cur_byte++];

    return ~crc;
}